

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  istream *piVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  mapped_type mVar8;
  long lVar9;
  _List_node_base *p_Var10;
  unsigned_long_long i_1;
  ulong uVar11;
  bool bVar12;
  string local_110;
  undefined1 local_f0 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  r;
  unsigned_long_long S1;
  unsigned_long_long S2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nums;
  unsigned_long_long L;
  string operation;
  undefined1 local_80 [8];
  string n1;
  string n2;
  unsigned_long_long H;
  
  piVar2 = std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::_M_extract<unsigned_long_long>((ulonglong *)piVar2);
  std::istream::ignore();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&S2,0x14,(allocator_type *)local_80);
  for (uVar7 = 0; uVar7 < (ulong)n2.field_2._8_8_; uVar7 = uVar7 + 1) {
    local_80 = (undefined1  [8])&n1._M_string_length;
    n1._M_dataplus._M_p = (pointer)0x0;
    n1._M_string_length._0_1_ = 0;
    std::operator>>((istream *)&std::cin,(string *)local_80);
    std::istream::ignore();
    if ((long)nums.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x14 - (long)n1._M_dataplus._M_p
        != 0) {
      __assert_fail("L*20 == nl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                    ,0x2c,"int main()");
    }
    lVar9 = 0;
    for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 1) {
      std::__cxx11::string::substr((ulong)(n1.field_2._M_local_buf + 8),(ulong)local_80);
      std::__cxx11::string::append((string *)(S2 + lVar9));
      std::__cxx11::string::~string((string *)(n1.field_2._M_local_buf + 8));
      lVar9 = lVar9 + 0x20;
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  lVar6 = 0;
  for (mVar8 = 0; mVar8 != 0x14; mVar8 = mVar8 + 1) {
    *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 2;
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,(string *)(S2 + lVar6));
    std::endl<char,std::char_traits<char>>(poVar3);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](&numbers_abi_cxx11_,(key_type *)(S2 + lVar6));
    *pmVar4 = mVar8;
    lVar6 = lVar6 + 0x20;
  }
  local_80 = (undefined1  [8])&n1._M_string_length;
  n1._M_dataplus._M_p = (pointer)0x0;
  n1._M_string_length._0_1_ = 0;
  std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::ignore();
  uVar7 = 0;
  uVar11 = 0;
  H._4_4_ = 0;
  do {
    if (r.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size <= uVar11) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"First number is ");
      poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      n1.field_2._8_8_ = &n2._M_string_length;
      n2._M_dataplus._M_p = (pointer)0x0;
      n2._M_string_length._0_1_ = 0;
      std::istream::_M_extract<unsigned_long_long>(&std::cin);
      std::istream::ignore();
      operation.field_2._8_8_ = 0;
      uVar11 = 0;
      goto LAB_00103765;
    }
    n1.field_2._8_8_ = &n2._M_string_length;
    n2._M_dataplus._M_p = (pointer)0x0;
    n2._M_string_length._0_1_ = 0;
    std::operator>>((istream *)&std::cin,(string *)(n1.field_2._M_local_buf + 8));
    std::istream::ignore();
    std::__cxx11::string::append((string *)local_80);
    bVar12 = true;
    if (uVar11 % (ulong)n2.field_2._8_8_ + 1 == n2.field_2._8_8_) {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
              ::find(&numbers_abi_cxx11_._M_t,(key_type *)local_80);
      if ((_Rb_tree_header *)iVar5._M_node == &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
         ) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown number ");
        poVar3 = std::operator<<(poVar3,(string *)local_80);
        std::endl<char,std::char_traits<char>>(poVar3);
        bVar12 = false;
        H._4_4_ = -1;
      }
      else {
        uVar7 = uVar7 * 0x14 + *(long *)(iVar5._M_node + 2);
        poVar3 = std::operator<<((ostream *)&std::cerr,"IR: ");
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::assign(local_80);
      }
    }
    std::__cxx11::string::~string((string *)(n1.field_2._M_local_buf + 8));
    uVar11 = uVar11 + 1;
  } while (bVar12);
LAB_001039eb:
  std::__cxx11::string::~string((string *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&S2);
  return H._4_4_;
LAB_00103765:
  if (S1 <= uVar11) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Second number is ");
    uVar1 = operation.field_2._8_8_;
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    operation._M_dataplus._M_p = (pointer)0x0;
    operation._M_string_length._0_1_ = 0;
    L = (unsigned_long_long)&operation._M_string_length;
    std::operator>>((istream *)&std::cin,(string *)&L);
    std::istream::ignore();
    switch(*(undefined1 *)L) {
    case 0x2a:
      uVar7 = uVar1 * uVar7;
      break;
    case 0x2b:
      uVar7 = uVar1 + uVar7;
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown operation");
      std::endl<char,std::char_traits<char>>(poVar3);
      H._4_4_ = -3;
      goto LAB_001039d6;
    case 0x2d:
      uVar7 = uVar7 - uVar1;
      break;
    case 0x2f:
      uVar7 = uVar7 / (ulong)uVar1;
    }
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_f0 = (undefined1  [8])local_f0;
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_f0;
    do {
      std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f0,(value_type *)((uVar7 % 0x14) * 0x20 + S2));
      bVar12 = 0x13 < uVar7;
      uVar7 = uVar7 / 0x14;
    } while (bVar12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    p_Var10 = (_List_node_base *)local_f0;
    while (p_Var10 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)local_f0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)(p_Var10 + 1));
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::string((string *)&local_110,(string *)(p_Var10 + 1));
      print_number(&local_110,n2.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0);
LAB_001039d6:
    std::__cxx11::string::~string((string *)&L);
LAB_001039e2:
    std::__cxx11::string::~string((string *)(n1.field_2._M_local_buf + 8));
    goto LAB_001039eb;
  }
  operation._M_dataplus._M_p = (pointer)0x0;
  operation._M_string_length._0_1_ = 0;
  L = (unsigned_long_long)&operation._M_string_length;
  std::operator>>((istream *)&std::cin,(string *)&L);
  std::istream::ignore();
  std::__cxx11::string::append((string *)(n1.field_2._M_local_buf + 8));
  bVar12 = true;
  if (uVar11 % (ulong)n2.field_2._8_8_ + 1 == n2.field_2._8_8_) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
            ::find(&numbers_abi_cxx11_._M_t,(key_type *)((long)&n1.field_2 + 8));
    bVar12 = (_Rb_tree_header *)iVar5._M_node ==
             &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
    if (bVar12) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown number ");
      poVar3 = std::operator<<(poVar3,(string *)(n1.field_2._M_local_buf + 8));
      std::endl<char,std::char_traits<char>>(poVar3);
      H._4_4_ = -1;
    }
    else {
      lVar6 = *(long *)(iVar5._M_node + 2);
      std::__cxx11::string::assign(n1.field_2._M_local_buf + 8);
      operation.field_2._8_8_ = lVar6 + operation.field_2._8_8_ * 0x14;
    }
    bVar12 = !bVar12;
  }
  std::__cxx11::string::~string((string *)&L);
  uVar11 = uVar11 + 1;
  if (!bVar12) goto LAB_001039e2;
  goto LAB_00103765;
}

Assistant:

int main()
{
    unsigned long long int L;
    unsigned long long int H;
    cin >> L >> H;
    cin.ignore();
    
    std::vector<std::string> nums(20);
    for (unsigned long long int i = 0; i < H; i++)
    {
        string numeral;
        cin >> numeral;
        cin.ignore();
        
        const size_t nl = numeral.length();
        assert(L*20 == nl);
        for (size_t i = 0; i < 20; i++)
        {
            nums[i] += numeral.substr(L*i, L);
        }
    }
    
    for (unsigned long long int i = 0; i < 20; i++)
    {
        cerr.width(2);
        cerr << i << ": " << nums[i] << endl;
        numbers[nums[i]] = i;
    }
    
    unsigned long long int S1;
    unsigned long long int N1 = 0;
    std::string n1;
    cin >> S1;
    cin.ignore();
    for (unsigned long long int i = 0; i < S1; i++)
    {
        string num1Line;
        cin >> num1Line;
        cin.ignore();
        n1 += num1Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni1 = numbers.find(n1);
            if (numbers.end() == ni1)
            {
                cerr << "Unknown number " << n1 << endl;
                return -1;
            }
            N1 = 20*N1 + ni1->second;
            cerr << "IR: " << N1 << endl;
            n1 = "";
        }
    }
    cerr << "First number is " << N1 << endl;
    
    unsigned long long int S2;
    unsigned long long int N2 = 0;
    std::string n2;
    cin >> S2;
    cin.ignore();
    for (unsigned long long int i = 0; i < S2; i++)
    {
        string num2Line;
        cin >> num2Line;
        cin.ignore();
        n2 += num2Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni2 = numbers.find(n2);
            if (numbers.end() == ni2)
            {
                cerr << "Unknown number " << n2 << endl;
                return -1;
            }
            N2 = 20*N2 + ni2->second;
            n2 = "";
        }
    }
    cerr << "Second number is " << N2 << endl;
    
    string operation;
    cin >> operation;
    cin.ignore();
    
    unsigned long long int result;
    switch (operation[0])
    {
        case '+':
            result = N1 + N2;
            break;
            
        case '-':
            result = N1 - N2;
            break;
            
        case '*':
            result = N1*N2;
            break;
            
        case '/':
            result = N1/N2;
            break;
            
        default:
            cerr << "Unknown operation" << endl;
            return -3;
    }
    
    std::list<std::string> r;
    do
    {
        cerr << result % 20;
        r.push_front(nums[result % 20]);
        result /= 20;
    } while (0 < result);
    cerr << endl;
    
    for (std::list<std::string>::const_iterator i = r.begin(); i != r.end(); i++)
    {
        cerr << *i << endl;
        print_number(*i, H);
    }
}